

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase754::run(TestCase754 *this)

{
  ReadableFile *pRVar1;
  long *plVar2;
  char *pcVar3;
  size_t sVar4;
  char *ptrCopy;
  bool bVar5;
  Own<kj::Directory> OVar6;
  StringPtr text;
  Own<const_kj::File> file;
  Own<kj::Directory> dir;
  TestClock clock;
  undefined8 *local_58;
  ReadableFile *local_50;
  undefined8 *local_48;
  long *local_40;
  String local_38;
  Clock local_20;
  undefined8 local_18;
  
  local_20._vptr_Clock = (_func_int **)&PTR_now_0043c488;
  local_18 = 1000000000;
  OVar6 = newInMemoryDirectory((kj *)&local_48,&local_20);
  (**(code **)(*local_40 + 0x78))(&local_58,local_40,OVar6.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_50,text);
  ReadableFile::readAllText(&local_38,local_50);
  sVar4 = local_38.content.size_;
  pcVar3 = local_38.content.ptr;
  bVar5 = true;
  if (local_38.content.size_ == 7) {
    bVar5 = (short)*(int *)((long)local_38.content.ptr + 4) != 0x7261 ||
            *(int *)local_38.content.ptr != 0x626f6f66;
  }
  if ((int *)local_38.content.ptr != (int *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  if ((bool)(bVar5 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f8,ERROR,"\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\"",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"");
  }
  (**(code **)(*local_40 + 0x30))(&local_38);
  sVar4 = local_38.content.size_;
  pcVar3 = local_38.content.ptr;
  if ((int *)local_38.content.ptr != (int *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar3,0x18,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((sVar4 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f9,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\"",
               (char (*) [45])"failed: expected dir->listNames() == nullptr");
  }
  pRVar1 = local_50;
  if (local_50 != (ReadableFile *)0x0) {
    local_50 = (ReadableFile *)0x0;
    (**(code **)*local_58)
              (local_58,(pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar1->super_FsNode);
  }
  plVar2 = local_40;
  if (local_40 != (long *)0x0) {
    local_40 = (long *)0x0;
    (**(code **)*local_48)(local_48,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }